

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

Entry * __thiscall
Lib::DHMap<SAT::SATLiteral,_Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2>::findEntry
          (DHMap<SAT::SATLiteral,_Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2> *this,
          SATLiteral *key)

{
  uint uVar1;
  uint uVar2;
  Entry *pEVar3;
  uint uVar4;
  Entry *pEVar5;
  size_t i;
  long lVar6;
  ulong uVar7;
  Entry *pEVar8;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 local_c;
  
  uVar1 = this->_capacity;
  if (uVar1 == 0) {
    pEVar8 = (Entry *)0x0;
  }
  else {
    local_c.field_1 =
         (anon_struct_4_2_b3f3f878_for_anon_union_4_2_6ac8864f_for_SATLiteral_0_1)
         (key->field_0)._content;
    uVar4 = 0x811c9dc5;
    lVar6 = 0;
    do {
      uVar4 = (*(byte *)((long)&local_c + lVar6) ^ uVar4) * 0x1000193;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    uVar7 = (ulong)uVar4 % (ulong)uVar1;
    pEVar3 = this->_entries;
    uVar4 = pEVar3[uVar7].field_0._infoData;
    pEVar8 = (Entry *)0x0;
    if (uVar4 >> 2 == this->_timestamp) {
      pEVar5 = pEVar3 + uVar7;
      if ((pEVar5->_key).field_0._content == local_c._content) {
        uVar4 = uVar4 & 1;
      }
      else {
        if ((uVar4 & 2) == 0) {
          return (Entry *)0x0;
        }
        do {
          uVar7 = (ulong)((int)uVar7 +
                         local_c._content % uVar1 + (uint)(local_c._content % uVar1 == 0)) %
                  (ulong)uVar1;
          pEVar5 = pEVar3 + uVar7;
          uVar2 = pEVar3[uVar7].field_0._infoData;
          if (uVar2 >> 2 != uVar4 >> 2) break;
        } while ((pEVar5->_key).field_0._content != local_c._content);
        uVar4 = uVar2 & 1 | (uVar2 ^ uVar4) >> 2;
      }
      pEVar8 = (Entry *)0x0;
      if (uVar4 == 0) {
        pEVar8 = pEVar5;
      }
    }
  }
  return pEVar8;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }